

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esfm_registers.c
# Opt level: O1

void ESFM_write_reg_buffered(esfm_chip *chip,uint16_t address,uint8_t data)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = chip->write_buf_end;
  if (chip->write_buf[sVar1].valid != '\0') {
    ESFM_write_reg(chip,chip->write_buf[sVar1].address,chip->write_buf[sVar1].data);
    chip->write_buf_start = (ulong)((int)chip->write_buf_end + 1U & 0x3ff);
  }
  chip->write_buf[sVar1].valid = '\x01';
  chip->write_buf[sVar1].address = address;
  chip->write_buf[sVar1].data = data;
  uVar2 = *(long *)((long)&chip->write_buf[0].timestamp + (ulong)(((int)sVar1 - 1U & 0x3ff) << 4)) +
          2;
  if (uVar2 <= chip->write_buf_timestamp) {
    uVar2 = chip->write_buf_timestamp;
  }
  chip->write_buf[sVar1].timestamp = uVar2;
  chip->write_buf_end = (ulong)((int)chip->write_buf_end + 1U & 0x3ff);
  return;
}

Assistant:

void
ESFM_write_reg_buffered (esfm_chip *chip, uint16_t address, uint8_t data)
{
	uint64_t timestamp;
	esfm_write_buf *new_entry, *last_entry;

	new_entry = &chip->write_buf[chip->write_buf_end];
	last_entry = &chip->write_buf[(chip->write_buf_end - 1) % ESFM_WRITEBUF_SIZE];

	if (new_entry->valid) {
		ESFM_write_reg(chip, new_entry->address, new_entry->data);
		chip->write_buf_start = (chip->write_buf_end + 1) % ESFM_WRITEBUF_SIZE;
	}

	new_entry->valid = 1;
	new_entry->address = address;
	new_entry->data = data;
	timestamp = last_entry->timestamp + ESFM_WRITEBUF_DELAY;
	if (timestamp < chip->write_buf_timestamp)
	{
		timestamp = chip->write_buf_timestamp;
	}

	new_entry->timestamp = timestamp;
	chip->write_buf_end = (chip->write_buf_end + 1) % ESFM_WRITEBUF_SIZE;
}